

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pullpush.c
# Opt level: O2

uint64_t pull_le64(uchar **cursor,size_t *max)

{
  leint64_t lev;
  
  pull_bytes(&lev,8,cursor,max);
  return lev;
}

Assistant:

uint64_t pull_le64(const unsigned char **cursor, size_t *max)
{
    leint64_t lev;
    pull_bytes(&lev, sizeof(lev), cursor, max);
    return le64_to_cpu(lev);
}